

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O1

LexicalScoping __thiscall
luna::SemanticAnalysisVisitor::SearchName(SemanticAnalysisVisitor *this,String *str)

{
  LexicalFunction *pLVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  LexicalBlock *pLVar5;
  __node_base_ptr p_Var6;
  LexicalScoping in_ECX;
  ulong uVar7;
  LexicalScoping LVar8;
  LexicalFunction *pLVar9;
  __node_base_ptr p_Var10;
  bool bVar11;
  
  pLVar1 = this->current_function_;
  if ((pLVar1 == (LexicalFunction *)0x0) ||
     (pLVar9 = pLVar1, pLVar1->current_block_ == (LexicalBlock *)0x0)) {
    __assert_fail("current_function_ && current_function_->current_block_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                  ,0x80,
                  "LexicalScoping luna::SemanticAnalysisVisitor::SearchName(const String *) const");
  }
  do {
    if (pLVar9 == (LexicalFunction *)0x0) {
      return LexicalScoping_Global;
    }
    LVar8 = pLVar9 == pLVar1 | LexicalScoping_Upvalue;
    for (pLVar5 = pLVar9->current_block_; pLVar5 != (LexicalBlock *)0x0; pLVar5 = pLVar5->parent_) {
      uVar2 = (pLVar5->names_)._M_h._M_bucket_count;
      uVar7 = (ulong)str % uVar2;
      p_Var3 = (pLVar5->names_)._M_h._M_buckets[uVar7];
      p_Var6 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var6 = p_Var3, p_Var10 = p_Var3->_M_nxt, (String *)p_Var3->_M_nxt[1]._M_nxt != str)) {
        while (p_Var4 = p_Var10->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var6 = (__node_base_ptr)0x0;
          if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar7) ||
             (p_Var6 = p_Var10, p_Var10 = p_Var4, (String *)p_Var4[1]._M_nxt == str))
          goto LAB_00155b19;
        }
        p_Var6 = (__node_base_ptr)0x0;
      }
LAB_00155b19:
      if (p_Var6 == (__node_base_ptr)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = p_Var6->_M_nxt == (_Hash_node_base *)0x0;
      }
      if (!bVar11) goto LAB_00155b48;
    }
    pLVar9 = pLVar9->parent_;
    LVar8 = in_ECX;
LAB_00155b48:
    in_ECX = LVar8;
    if (pLVar5 != (LexicalBlock *)0x0) {
      return LVar8;
    }
  } while( true );
}

Assistant:

LexicalScoping SearchName(const String *str) const
        {
            assert(current_function_ && current_function_->current_block_);

            auto function = current_function_;
            while (function)
            {
                auto block = function->current_block_;
                while (block)
                {
                    auto it = block->names_.find(str);
                    if (it != block->names_.end())
                    {
                        return function == current_function_ ?
                            LexicalScoping_Local : LexicalScoping_Upvalue;
                    }

                    block = block->parent_;
                }

                function = function->parent_;
            }

            return LexicalScoping_Global;
        }